

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O1

_Bool upb_MessageDef_MiniDescriptorEncode(upb_MessageDef *m,upb_Arena *a,upb_StringView *out)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  upb_FieldType uVar4;
  upb_FieldType value_type;
  uint32_t uVar5;
  int iVar6;
  upb_FieldDef *puVar7;
  upb_FieldDef *f;
  uint64_t uVar8;
  uint64_t value_mod;
  upb_FieldDef **ppuVar9;
  ulong uVar10;
  upb_OneofDef *o;
  bool bVar11;
  uint uVar12;
  int i;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  long lVar16;
  upb_DescState s;
  upb_DescState local_70;
  
  local_70.bufsize = 0x20;
  local_70.buf = (char *)0x0;
  local_70.ptr = (char *)0x0;
  _Var2 = _upb_DescState_Grow(&local_70,a);
  if (_Var2) {
    if ((m->opts[1].base_dont_copy_me__upb_internal_use_only.field_0.internal_opaque & 0x100000000)
        == 0) {
      if ((m->opts[1].base_dont_copy_me__upb_internal_use_only.field_0.internal_opaque & 0x100) == 0
         ) {
        if (m->is_sorted == false) {
          ppuVar9 = _upb_FieldDefs_Sorted(m->fields,m->field_count,a);
          if (ppuVar9 == (upb_FieldDef **)0x0) {
            return false;
          }
        }
        else {
          ppuVar9 = (upb_FieldDef **)0x0;
        }
        pcVar1 = local_70.ptr;
        iVar3 = *(int *)((long)&m->resolved_features[2].base_dont_copy_me__upb_internal_use_only.
                                field_0 + 4);
        uVar13 = 0;
        bVar11 = m->field_count < 1;
        if (0 < m->field_count) {
          bVar14 = 0;
          bVar15 = 0;
          do {
            puVar7 = upb_MessageDef_Field(m,(int)uVar13);
            _Var2 = _upb_FieldDef_ValidateUtf8(puVar7);
            if (_Var2) {
              uVar4 = upb_FieldDef_Type(puVar7);
              bVar15 = bVar14;
              if (uVar4 == kUpb_FieldType_String) {
                bVar14 = 1;
                bVar15 = 1;
              }
            }
            if (!_Var2) break;
            uVar12 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar12;
            bVar11 = m->field_count <= (int)uVar12;
          } while ((int)uVar12 < m->field_count);
          uVar13 = 0;
          if (bVar11) {
            uVar13 = (ulong)bVar15;
          }
        }
        uVar10 = (ulong)(iVar3 == 1);
        uVar8 = uVar13 + 4 + uVar10 * 2;
        if (m->ext_range_count == 0) {
          uVar8 = uVar13 + uVar10 * 2;
        }
        local_70.ptr = upb_MtDataEncoder_StartMessage(&local_70.e,pcVar1,uVar8);
        if (0 < m->field_count) {
          lVar16 = 0;
          do {
            if (ppuVar9 == (upb_FieldDef **)0x0) {
              puVar7 = upb_MessageDef_Field(m,(int)lVar16);
            }
            else {
              puVar7 = ppuVar9[lVar16];
            }
            uVar4 = upb_FieldDef_Type(puVar7);
            uVar5 = upb_FieldDef_Number(puVar7);
            uVar8 = _upb_FieldDef_Modifiers(puVar7);
            _Var2 = _upb_DescState_Grow(&local_70,a);
            if (!_Var2) {
              return false;
            }
            local_70.ptr = upb_MtDataEncoder_PutField(&local_70.e,local_70.ptr,uVar4,uVar5,uVar8);
            lVar16 = lVar16 + 1;
          } while (lVar16 < m->field_count);
        }
        bVar11 = m->real_oneof_count < 1;
        if (0 < m->real_oneof_count) {
          iVar3 = 0;
          while (_Var2 = _upb_DescState_Grow(&local_70,a), _Var2) {
            local_70.ptr = upb_MtDataEncoder_StartOneof(&local_70.e,local_70.ptr);
            o = upb_MessageDef_Oneof(m,iVar3);
            iVar6 = upb_OneofDef_FieldCount(o);
            if (0 < iVar6) {
              i = 0;
              do {
                puVar7 = upb_OneofDef_Field(o,i);
                uVar5 = upb_FieldDef_Number(puVar7);
                _Var2 = _upb_DescState_Grow(&local_70,a);
                if (!_Var2) goto LAB_0011cabb;
                local_70.ptr = upb_MtDataEncoder_PutOneofField(&local_70.e,local_70.ptr,uVar5);
                i = i + 1;
              } while (iVar6 != i);
            }
            iVar3 = iVar3 + 1;
            bVar11 = m->real_oneof_count <= iVar3;
            if (m->real_oneof_count <= iVar3) break;
          }
        }
LAB_0011cabb:
        if (!bVar11) {
          return false;
        }
      }
      else {
        local_70.ptr = upb_MtDataEncoder_EncodeMessageSet(&local_70.e,local_70.ptr);
      }
    }
    else {
      if (m->field_count != 2) {
        return false;
      }
      puVar7 = upb_MessageDef_Field(m,0);
      f = upb_MessageDef_Field(m,1);
      if (f == (upb_FieldDef *)0x0 || puVar7 == (upb_FieldDef *)0x0) {
        return false;
      }
      iVar3 = _upb_FieldDef_LayoutIndex(puVar7);
      if (iVar3 != 0) {
        __assert_fail("_upb_FieldDef_LayoutIndex(key_field) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/reflection/message_def.c"
                      ,0x236,
                      "_Bool _upb_MessageDef_EncodeMap(upb_DescState *, const upb_MessageDef *, upb_Arena *)"
                     );
      }
      iVar3 = _upb_FieldDef_LayoutIndex(f);
      pcVar1 = local_70.ptr;
      if (iVar3 != 1) {
        __assert_fail("_upb_FieldDef_LayoutIndex(val_field) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/reflection/message_def.c"
                      ,0x237,
                      "_Bool _upb_MessageDef_EncodeMap(upb_DescState *, const upb_MessageDef *, upb_Arena *)"
                     );
      }
      uVar4 = upb_FieldDef_Type(puVar7);
      value_type = upb_FieldDef_Type(f);
      uVar8 = _upb_FieldDef_Modifiers(puVar7);
      value_mod = _upb_FieldDef_Modifiers(f);
      local_70.ptr = upb_MtDataEncoder_EncodeMap
                               (&local_70.e,pcVar1,uVar4,value_type,uVar8,value_mod);
    }
    _Var2 = _upb_DescState_Grow(&local_70,a);
    if (_Var2) {
      *local_70.ptr = '\0';
      out->data = local_70.buf;
      out->size = (long)local_70.ptr - (long)local_70.buf;
      return true;
    }
  }
  return false;
}

Assistant:

bool upb_MessageDef_MiniDescriptorEncode(const upb_MessageDef* m, upb_Arena* a,
                                         upb_StringView* out) {
  upb_DescState s;
  _upb_DescState_Init(&s);

  if (!_upb_DescState_Grow(&s, a)) return false;

  if (upb_MessageDef_IsMapEntry(m)) {
    if (!_upb_MessageDef_EncodeMap(&s, m, a)) return false;
  } else if (UPB_DESC(MessageOptions_message_set_wire_format)(m->opts)) {
    if (!_upb_MessageDef_EncodeMessageSet(&s, m, a)) return false;
  } else {
    if (!_upb_MessageDef_EncodeMessage(&s, m, a)) return false;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  *s.ptr = '\0';

  out->data = s.buf;
  out->size = s.ptr - s.buf;
  return true;
}